

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_>::reserve
          (vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_>
           *this,size_t n)

{
  memory_resource *pmVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar4;
  Point2<float> *pPVar3;
  
  if (this->nAlloc < n) {
    if (n * 8 == 0) {
      pPVar3 = (Point2<float> *)0x0;
    }
    else {
      pmVar1 = (this->alloc).memoryResource;
      iVar2 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n * 8,4);
      pPVar3 = (Point2<float> *)CONCAT44(extraout_var,iVar2);
    }
    if (this->nStored != 0) {
      uVar4 = 0;
      do {
        pPVar3[uVar4].super_Tuple2<pbrt::Point2,_float> =
             this->ptr[uVar4].super_Tuple2<pbrt::Point2,_float>;
        uVar4 = uVar4 + 1;
      } while (uVar4 < this->nStored);
    }
    if (this->ptr != (Point2<float> *)0x0) {
      pmVar1 = (this->alloc).memoryResource;
      (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc << 3,4);
    }
    this->nAlloc = n;
    this->ptr = pPVar3;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }